

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptSet>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptSet> *this)

{
  int iVar1;
  MapOrSetDataNode<void_*> *pMVar2;
  List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  bool bVar3;
  Iterator iterator;
  
  VarTo<Js::JavascriptSet>(this->instance);
  JavascriptSet::GetIterator((JavascriptSet *)&stack0xffffffffffffffc8);
  while( true ) {
    bVar3 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)&stack0xffffffffffffffc8);
    if (!bVar3) break;
    pMVar2 = iterator.list.ptr[1].first.ptr;
    this_00 = this->propertyList;
    JsUtil::
    List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(this_00,0);
    iVar1 = (this_00->
            super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
    (this_00->
    super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>,_Memory::ArenaAllocator,_DefaultComparer>
    ).buffer[iVar1].value = pMVar2;
    (this_00->
    super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>,_Memory::ArenaAllocator,_DefaultComparer>
    ).count = iVar1 + 1;
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptSet>::GetChildren()
    {
        JavascriptSet* data = VarTo<JavascriptSet>(instance);
        auto iterator = data->GetIterator();
        while (iterator.Next())
        {
            Var value = iterator.Current();
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptSet>(value));
        }
    }